

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O0

void __thiscall
asio::detail::op_queue<asio::detail::reactor_op>::push
          (op_queue<asio::detail::reactor_op> *this,reactor_op *h)

{
  reactor_op *local_18;
  reactor_op *h_local;
  op_queue<asio::detail::reactor_op> *this_local;
  
  local_18 = h;
  h_local = (reactor_op *)this;
  op_queue_access::next<asio::detail::reactor_op,asio::detail::reactor_op>
            (&local_18,(reactor_op *)0x0);
  if (this->back_ == (reactor_op *)0x0) {
    this->back_ = local_18;
    this->front_ = local_18;
  }
  else {
    op_queue_access::next<asio::detail::reactor_op,asio::detail::reactor_op>(&this->back_,local_18);
    this->back_ = local_18;
  }
  return;
}

Assistant:

void push(Operation* h)
  {
    op_queue_access::next(h, static_cast<Operation*>(0));
    if (back_)
    {
      op_queue_access::next(back_, h);
      back_ = h;
    }
    else
    {
      front_ = back_ = h;
    }
  }